

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcConstVal::set_float(CTcConstVal *this,vbignum_t *val,int promoted)

{
  char *pcVar1;
  size_t len_00;
  int in_EDX;
  CTcConstVal *in_RDI;
  size_t len;
  char *buf;
  CBigNumStringBufPrsAlo alo;
  CBigNumStringBufPrsAlo *in_stack_ffffffffffffffd0;
  IBigNumStringBuf *in_stack_ffffffffffffffd8;
  vbignum_t *in_stack_ffffffffffffffe0;
  
  CBigNumStringBufPrsAlo::CBigNumStringBufPrsAlo(in_stack_ffffffffffffffd0);
  pcVar1 = vbignum_t::format(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  len_00 = vmb_get_len((char *)0x2a3953);
  set_float(in_RDI,pcVar1 + 2,len_00,in_EDX);
  return;
}

Assistant:

void CTcConstVal::set_float(const vbignum_t *val, int promoted)
{
    /* format the value */
    CBigNumStringBufPrsAlo alo;
    const char *buf = val->format(&alo);

    /* 
     *   read the length from the buffer - vbignum_t::format() fills in the
     *   buffer using the TADS String format, with a two-byte little-endian
     *   (VMB_LEN) length prefix 
     */
    size_t len = vmb_get_len(buf);
    buf += VMB_LEN;

    /* store it */
    set_float(buf, len, promoted);
}